

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticsReporter_DeclarationBinder.cpp
# Opt level: O2

void __thiscall
psy::C::DeclarationBinder::DiagnosticsReporter::FunctionReturningArray
          (DiagnosticsReporter *this,SyntaxToken *decltorTk)

{
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s;
  DiagnosticDescriptor local_c0;
  SyntaxToken local_58;
  
  SyntaxToken::valueText_abi_cxx11_(&local_100,decltorTk);
  std::operator+(&local_c0.id_,"`",&local_100);
  std::operator+(&s,&local_c0.id_,"\' declared as function returning an array");
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::string(local_120,(string *)&ID_of_FunctionReturningArray_abi_cxx11_);
  std::__cxx11::string::string<std::allocator<char>>
            (local_140,"[[function returning array]]",(allocator<char> *)&local_100);
  std::__cxx11::string::string(local_160,(string *)&s);
  psy::DiagnosticDescriptor::DiagnosticDescriptor(&local_c0,local_120,local_140,local_160,2,2);
  local_58.field_10 = decltorTk->field_10;
  local_58.tree_ = decltorTk->tree_;
  local_58.syntaxK_ = decltorTk->syntaxK_;
  local_58.byteSize_ = decltorTk->byteSize_;
  local_58.charSize_ = decltorTk->charSize_;
  local_58._14_2_ = *(undefined2 *)&decltorTk->field_0xe;
  local_58.byteOffset_ = decltorTk->byteOffset_;
  local_58.charOffset_ = decltorTk->charOffset_;
  local_58.matchingBracket_ = decltorTk->matchingBracket_;
  local_58.field_7 = decltorTk->field_7;
  local_58._34_2_ = *(undefined2 *)&decltorTk->field_0x22;
  local_58.lineno_ = decltorTk->lineno_;
  local_58.column_ = decltorTk->column_;
  local_58._44_4_ = *(undefined4 *)&decltorTk->field_0x2c;
  diagnose(this,&local_c0,&local_58);
  SyntaxToken::~SyntaxToken(&local_58);
  DiagnosticDescriptor::~DiagnosticDescriptor(&local_c0);
  std::__cxx11::string::~string(local_160);
  std::__cxx11::string::~string(local_140);
  std::__cxx11::string::~string(local_120);
  std::__cxx11::string::~string((string *)&s);
  return;
}

Assistant:

void DeclarationBinder::DiagnosticsReporter::FunctionReturningArray(SyntaxToken decltorTk)
{
    auto s = "`"
            + decltorTk.valueText()
            + "' declared as function returning an array";

    diagnose(DiagnosticDescriptor(
                 ID_of_FunctionReturningArray,
                 "[[function returning array]]",
                 s,
                 DiagnosticSeverity::Error,
                 DiagnosticCategory::Binding),
             decltorTk);
}